

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdi.cpp
# Opt level: O1

bool ReadFDI(MemFile *file,shared_ptr<Disk> *disk)

{
  element_type *peVar1;
  byte bVar2;
  byte bVar3;
  char extraout_AL;
  bool bVar4;
  uint16_t uVar5;
  int iVar6;
  int iVar7;
  ssize_t sVar8;
  mapped_type *pmVar9;
  exception *peVar10;
  size_t in_RCX;
  size_t __nbytes;
  uint uVar11;
  uint size;
  bool bVar12;
  bool bVar13;
  FDI_SECTOR fs;
  CRC16 crc;
  FDI_TRACK ft;
  CylHead cylhead;
  FDI_HEADER fh;
  Data data;
  Track track;
  int sector_size;
  int sector_pos;
  Sector sector;
  byte local_129;
  byte local_128;
  byte local_127;
  byte local_126;
  byte local_125;
  ushort local_124;
  CRC16 local_122;
  uint local_120;
  int local_11c;
  byte local_117;
  byte local_116;
  byte local_115;
  byte local_111;
  char *local_110;
  uint local_108;
  uint local_104;
  uint local_100;
  uint local_fc;
  vector<char,_std::allocator<char>_> local_f8;
  short local_de;
  char local_dc;
  byte local_da;
  byte local_d8;
  ushort local_d6;
  ushort local_d4;
  ushort local_d2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d0;
  undefined1 local_b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  shared_ptr<Disk> *local_90;
  MemFile *local_88;
  uint local_80;
  int local_7c;
  int local_78;
  int local_74;
  DataRate *local_70 [2];
  long local_60 [3];
  vector<Data,_std::allocator<Data>_> local_48;
  
  local_90 = disk;
  MemFile::rewind(file,(FILE *)disk);
  if (((extraout_AL == '\0') ||
      (sVar8 = MemFile::read(file,(int)&local_de,(void *)0xe,in_RCX), (char)sVar8 == '\0')) ||
     (local_dc != 'I' || local_de != 0x4446)) {
    bVar4 = false;
  }
  else {
    uVar11 = (uint)local_da;
    local_100 = (uint)local_d8;
    __nbytes = 0x200;
    Format::Validate(uVar11,local_100,1,0x200,0);
    local_104 = (uint)local_d4;
    MemFile::seek(file,local_d2 + 0xe);
    local_80 = uVar11;
    if (local_da != 0) {
      local_120 = 0;
      local_88 = file;
      do {
        if ((char)local_100 != '\0') {
          uVar11 = 0;
          do {
            local_108 = uVar11;
            CylHead::CylHead((CylHead *)&local_f8,local_120,local_108);
            Track::Track((Track *)local_b0,0);
            sVar8 = MemFile::read(file,(int)&local_117,(void *)0x7,__nbytes);
            if ((char)sVar8 == '\0') {
              peVar10 = (exception *)__cxa_allocate_exception(0x10);
              util::exception::exception<char_const(&)[20],CylHead&>
                        (peVar10,(char (*) [20])"short file reading ",(CylHead *)&local_f8);
LAB_0019150f:
              __cxa_throw(peVar10,&util::exception::typeinfo,std::runtime_error::~runtime_error);
            }
            if (0x90 < local_111) {
              peVar10 = (exception *)__cxa_allocate_exception(0x10);
              util::exception::exception<CylHead&,char_const(&)[24],unsigned_char&,char_const(&)[2]>
                        (peVar10,(CylHead *)&local_f8,(char (*) [24])" has too many sectors (",
                         &local_111,(char (*) [2])0x1aefa0);
              goto LAB_0019150f;
            }
            __nbytes = (size_t)local_117;
            local_11c = 0;
            if (local_111 != 0) {
              local_7c = ((uint)local_116 << 8 | (uint)local_115 << 0x10 | (uint)local_117) +
                         local_104;
              do {
                sVar8 = MemFile::read(file,(int)&local_129,(void *)0x7,__nbytes);
                if ((char)sVar8 == '\0') {
                  peVar10 = (exception *)__cxa_allocate_exception(0x10);
                  util::exception::exception<char_const(&)[20],CylHead&,char_const(&)[15],int&>
                            (peVar10,(char (*) [20])"short file reading ",(CylHead *)&local_f8,
                             (char (*) [15])" sector index ",&local_11c);
                  __cxa_throw(peVar10,&util::exception::typeinfo,std::runtime_error::~runtime_error)
                  ;
                }
                Header::Header((Header *)&local_d0,(uint)local_129,(uint)local_128,(uint)local_127,
                               (uint)local_126);
                Sector::Sector((Sector *)local_70,_250K,MFM,(Header *)&local_d0,0);
                bVar2 = local_125;
                bVar13 = -1 < (char)local_125;
                iVar6 = MemFile::tell(file);
                local_74 = (uint)local_124 + local_7c;
                bVar4 = MemFile::seek(file,local_74);
                if (!bVar4) {
                  peVar10 = (exception *)__cxa_allocate_exception(0x10);
                  util::exception::
                  exception<char_const(&)[19],CylHead&,char_const(&)[9],unsigned_char&,char_const(&)[8],int&>
                            (peVar10,(char (*) [19])"failed to seek to ",(CylHead *)&local_f8,
                             (char (*) [9])0x1b0f03,&local_127,(char (*) [8])" data @",&local_74);
                  __cxa_throw(peVar10,&util::exception::typeinfo,std::runtime_error::~runtime_error)
                  ;
                }
                uVar11 = local_126 & 3;
                local_78 = Sector::SizeCodeToLength(uVar11);
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                          (&local_d0,(long)local_78,(allocator_type *)&local_110);
                MemFile::read(local_88,(int)local_d0.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start,(void *)0x1,
                              (ulong)(uint)((int)local_d0.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                           (int)local_d0.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start));
                MemFile::seek(local_88,iVar6);
                bVar4 = true;
                local_fc = (uint)(byte)(bVar13 * '\x03' - 8);
                if ((bVar2 & 0x40) == 0) {
                  bVar13 = true;
                  bVar4 = true;
                  size = 0;
                  do {
                    iVar6 = Sector::SizeCodeToLength(size);
                    iVar7 = Sector::SizeCodeToLength((uint)local_126);
                    if (iVar6 == iVar7) {
                      bVar4 = bVar13;
                      if ((local_125 >> (size & 0x1f) & 1) != 0) {
                        bVar13 = false;
                        bVar4 = false;
                      }
LAB_00190fd0:
                      local_125 = local_125 & ~(byte)(1 << ((byte)size & 0x1f));
                    }
                    else if (size <= uVar11) {
                      CRC16::CRC16(&local_122,0xcdb4);
                      CRC16::add(&local_122,local_fc);
                      CRC16::add(&local_122,
                                 local_d0.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,(long)iVar6);
                      if (uVar11 == size) {
                        if ((local_125 >> (size & 0x1f) & 1) != 0) {
                          uVar5 = CRC16::operator_cast_to_unsigned_short(&local_122);
                          local_110._0_1_ = SUB21(uVar5 >> 8,0);
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                          emplace_back<unsigned_char>(&local_d0,(uchar *)&local_110);
                          uVar5 = CRC16::operator_cast_to_unsigned_short(&local_122);
                          local_110 = (char *)CONCAT71(local_110._1_7_,(char)uVar5);
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                          emplace_back<unsigned_char>(&local_d0,(uchar *)&local_110);
                        }
                      }
                      else {
                        CRC16::add(&local_122,
                                   local_d0.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start + iVar6,2);
                        bVar3 = local_125;
                        uVar5 = CRC16::operator_cast_to_unsigned_short(&local_122);
                        if (((uVar5 != 0 ^ bVar3 >> ((byte)size & 0x1f)) & 1) == 0) {
                          local_110 = CHR(local_120,local_108,(uint)local_127);
                          Message<int&,char_const*>
                                    (msgWarning,"inconsistent CRC flag for size=%d for %s",&local_78
                                     ,&local_110);
                        }
                      }
                      goto LAB_00190fd0;
                    }
                  } while (((bVar2 & 0x40) == 0) && (bVar12 = size < 3, size = size + 1, bVar12));
                }
                if ((local_125 & 0x3f) != 0) {
                  local_110 = CHSR(local_120,local_108,local_11c,(uint)local_127);
                  Message<unsigned_char&,char_const*>
                            (msgWarning,"unexpected flags (%02X) on %s",&local_125,&local_110);
                }
                Sector::add((Sector *)local_70,(Data *)&local_d0,bVar4,(uint8_t)local_fc);
                Track::add((Track *)local_b0,(Sector *)local_70);
                if (local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_d0.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_d0.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_d0.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                std::vector<Data,_std::allocator<Data>_>::~vector(&((Sector *)local_70)->m_data);
                local_11c = local_11c + 1;
                __nbytes = (size_t)local_111;
                file = local_88;
              } while (local_11c < (int)(uint)local_111);
            }
            Disk::write((local_90->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                        (int)&local_f8,local_b0,__nbytes);
            std::vector<Sector,_std::allocator<Sector>_>::~vector
                      ((vector<Sector,_std::allocator<Sector>_> *)(local_b0 + 8));
            uVar11 = local_108 + 1;
          } while (local_108 + 1 != local_100);
        }
        local_120 = local_120 + 1;
      } while (local_120 != local_80);
    }
    if (local_d6 != 0) {
      uVar11 = (uint)local_d6;
      bVar4 = MemFile::seek(file,uVar11);
      if (bVar4) {
        iVar6 = 0x100;
        if (uVar11 <= local_104 && local_104 - uVar11 != 0) {
          iVar6 = local_104 - uVar11;
        }
        std::vector<char,_std::allocator<char>_>::vector
                  (&local_f8,(long)iVar6,(allocator_type *)local_70);
        iVar7 = (int)local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
                (int)local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start;
        iVar6 = MemFile::remaining(file);
        if (iVar6 < iVar7) {
          peVar10 = (exception *)__cxa_allocate_exception(0x10);
          util::exception::exception<char_const(&)[27]>
                    (peVar10,(char (*) [27])"short file reading comment");
          __cxa_throw(peVar10,&util::exception::typeinfo,std::runtime_error::~runtime_error);
        }
        memcpy(local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,(file->m_it)._M_current,(long)iVar7);
        (file->m_it)._M_current = (file->m_it)._M_current + iVar7;
        local_70[0] = &((Sector *)local_70)->datarate;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_70,
                   local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        std::__cxx11::string::substr((ulong)local_b0,(ulong)local_70);
        iVar6 = std::__cxx11::string::compare(local_b0);
        if (iVar6 == 0) {
          bVar4 = false;
        }
        else {
          std::__cxx11::string::substr((ulong)&local_d0,(ulong)local_70);
          iVar6 = std::__cxx11::string::compare((char *)&local_d0);
          bVar4 = iVar6 != 0;
          if ((pointer *)
              local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start !=
              &local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) {
            operator_delete(local_d0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (ulong)(local_d0.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._0_8_ != &local_a0) {
          operator_delete((void *)local_b0._0_8_,(ulong)(local_a0._M_allocated_capacity + 1));
        }
        if (bVar4) {
          peVar1 = (local_90->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_b0._0_8_ = &local_a0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"comment","");
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&peVar1->metadata,(key_type *)local_b0);
          std::__cxx11::string::_M_assign((string *)pmVar9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._0_8_ != &local_a0) {
            operator_delete((void *)local_b0._0_8_,(ulong)(local_a0._M_allocated_capacity + 1));
          }
        }
        if (local_70[0] != &((Sector *)local_70)->datarate) {
          operator_delete(local_70[0],local_60[0] + 1);
        }
        if ((CylHead)local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start != (CylHead)0x0) {
          operator_delete(local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
    }
    peVar1 = (local_90->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__cxx11::string::_M_replace
              ((ulong)&peVar1->strType,0,(char *)(peVar1->strType)._M_string_length,0x1b0cca);
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool ReadFDI(MemFile& file, std::shared_ptr<Disk>& disk)
{
    FDI_HEADER fh;
    if (!file.rewind() || !file.read(&fh, sizeof(fh)))
        return false;
    else if (memcmp(fh.abSignature, FDI_SIGNATURE, sizeof(fh.abSignature)))
        return false;

    int cyls = fh.bTracks[0];
    int heads = fh.bSides[0];
    Format::Validate(cyls, heads);

    auto data_pos = (fh.bDataOffset[1] << 8) | fh.bDataOffset[0];
    auto header_pos = static_cast<int>(sizeof(FDI_HEADER)) + ((fh.bExtraSize[1] << 8) | fh.bExtraSize[0]);
    file.seek(header_pos);

    //  uint8_t* pbData = pb + fh.bDataOffset[0];
    //  auto pbHeaders = (uint8_t*)&fh.bExtraSize + sizeof(fh.bExtraSize) + ((fh.bExtraSize[1] << 8) | fh.bExtraSize[0]);

    for (auto cyl = 0; cyl < cyls; ++cyl)
    {
        for (auto head = 0; head < heads; ++head)
        {
            CylHead cylhead(cyl, head);
            Track track;

            FDI_TRACK ft;
            if (!file.read(&ft, sizeof(ft)))
                throw util::exception("short file reading ", cylhead);

            if (ft.sectors > MAX_SECTORS)
                throw util::exception(cylhead, " has too many sectors (", ft.sectors, ")");

            auto track_pos = data_pos + (/*(ft.abTrackOffset[3] << 24) |*/ (ft.abTrackOffset[2] << 16) |
                (ft.abTrackOffset[1] << 8) | ft.abTrackOffset[0]);

            for (int i = 0; i < ft.sectors; ++i)
            {
                FDI_SECTOR fs;
                if (!file.read(&fs, sizeof(fs)))
                    throw util::exception("short file reading ", cylhead, " sector index ", i);

                Sector sector(DataRate::_250K, Encoding::MFM, Header(fs.bTrack, fs.bSide, fs.bSector, fs.bSize));

                bool deleted_data = (fs.bFlags & 0x80) != 0;
                bool no_data = (fs.bFlags & 0x40) != 0;
                bool bad_data = true;   // until we learn otherwise
                uint8_t dam = deleted_data ? 0xf8 : 0xfb;

                auto old_pos = file.tell();
                auto sector_pos = track_pos + ((fs.bSectorOffset[1] << 8) | fs.bSectorOffset[0]);
                if (!file.seek(sector_pos))
                    throw util::exception("failed to seek to ", cylhead, " sector ", fs.bSector, " data @", sector_pos);

                // Use only 2 bits of the size, to match FD1793 behaviour
                uint8_t b1793Size = fs.bSize & 3;
                auto sector_size = Sector::SizeCodeToLength(b1793Size);

                Data data(sector_size); // always allocate full PC size, plus room for CRC
                file.read(data.data(), 1, static_cast<int>(data.size()));
                file.seek(old_pos);

                // Loop through valid size codes to check the flag bits
                for (uint8_t size = 0; !no_data && size <= 3; ++size)
                {
                    auto ssize = Sector::SizeCodeToLength(size);

                    // Does the size match the PC treatment of the size code?
                    if (ssize == Sector::SizeCodeToLength(fs.bSize))
                    {
                        // If the flags say no error, clear the data CRC error
                        if (fs.bFlags & (1 << size))
                            bad_data = false;
                    }
                    // Or is it within the current FD1793 size?
                    else if (size <= b1793Size)
                    {
                        CRC16 crc(CRC16::A1A1A1);
                        crc.add(dam);
                        crc.add(data.data(), ssize);

                        // If the size matches, there are no CRC bytes in the data
                        if (size == b1793Size)
                        {
                            // Do the flags indicate the CRC is good?
                            if (fs.bFlags & (1 << size))
                            {
                                // Add the calculated CRC bytes to to preserve the status
                                data.push_back(crc >> 8);
                                data.push_back(crc & 0xff);
                            }
                        }
                        else
                        {
                            // Continue reading into the data to check the CRC
                            crc.add(data.data() + ssize, 2);

                            // Ensure the CRC status matches the flags
                            if (!!(fs.bFlags & (1 << size)) != (crc ? 0 : 1))
                                Message(msgWarning, "inconsistent CRC flag for size=%d for %s", sector_size, CHR(cyl, head, fs.bSector));
                        }
                    }
                    else
                    {
                        // Skip clearing the flag so we warn any set bit below
                        continue;
                    }

                    // Reset the bit for this size, whether or not we used it
                    fs.bFlags &= ~(1 << size);
                }

                // Warn about any remaining flags, in case we're missing something
                if (fs.bFlags & ~0xc0)
                    Message(msgWarning, "unexpected flags (%02X) on %s", fs.bFlags, CHSR(cyl, head, i, fs.bSector));

                sector.add(std::move(data), bad_data, dam);
                track.add(std::move(sector));
            }

            disk->write(cylhead, std::move(track));
        }
    }

    auto desc_pos = (fh.bDescOffset[1] << 8) | fh.bDescOffset[0];
    if (desc_pos && file.seek(desc_pos))
    {
        // Read the comment block
        auto len = (data_pos > desc_pos) ? (data_pos - desc_pos) : 256;
        std::vector<char> comment(len);
        if (!file.read(comment))
            throw util::exception("short file reading comment");
        std::string str = std::string(comment.data(), comment.size());

        // To avoid confusion, don't store the default TDCVT comment
        if (str.substr(0, 29) != "\r\n'This file created by TDCVT" && str.substr(0, 3) != "FDI")
            disk->metadata["comment"] = str;
    }

    disk->strType = "FDI";
    return true;
}